

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O0

bool __thiscall
BamTools::BamAlignment::GetSoftClips
          (BamAlignment *this,vector<int,_std::allocator<int>_> *clipSizes,
          vector<int,_std::allocator<int>_> *readPositions,
          vector<int,_std::allocator<int>_> *genomePositions,bool usePadded)

{
  bool bVar1;
  reference pCVar2;
  value_type_conflict1 *in_RDI;
  byte in_R8B;
  CigarOp *op;
  const_iterator cigarEnd;
  const_iterator cigarIter;
  bool firstCigarOp;
  bool softClipFound;
  int readPosition;
  int refPosition;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t uVar3;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_38;
  byte local_2e;
  byte local_2d;
  int local_2c;
  int local_28;
  byte local_21;
  
  local_21 = in_R8B & 1;
  local_28 = in_RDI[0x2b];
  local_2c = 0;
  local_2d = 0;
  local_2e = 1;
  local_38._M_current =
       (CigarOp *)
       std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                 (in_stack_ffffffffffffff98);
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end(in_stack_ffffffffffffff98)
  ;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      return (bool)(local_2d & 1);
    }
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
             ::operator*(&local_38);
    in_stack_ffffffffffffffa4 = (int)pCVar2->Type;
    if ((in_stack_ffffffffffffffa4 == 0x3d) || (in_stack_ffffffffffffffa4 == 0x44)) {
LAB_002c0b16:
      local_28 = pCVar2->Length + local_28;
      local_2c = pCVar2->Length + local_2c;
    }
    else if (in_stack_ffffffffffffffa4 == 0x49) {
      local_2c = pCVar2->Length + local_2c;
      if ((local_21 & 1) != 0) {
        local_28 = pCVar2->Length + local_28;
      }
    }
    else {
      if (in_stack_ffffffffffffffa4 - 0x4dU < 2) goto LAB_002c0b16;
      if (in_stack_ffffffffffffffa4 == 0x53) {
        local_2d = 1;
        if ((local_2e & 1) != 0) {
          local_2c = pCVar2->Length + local_2c;
        }
        uVar3 = pCVar2->Length;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(0x53,in_stack_ffffffffffffffa0),
                   (value_type_conflict1 *)in_stack_ffffffffffffff98);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                   in_RDI);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                   in_RDI);
      }
      else if (in_stack_ffffffffffffffa4 == 0x58) goto LAB_002c0b16;
    }
    local_2e = 0;
    __gnu_cxx::
    __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

bool BamAlignment::GetSoftClips(std::vector<int>& clipSizes, std::vector<int>& readPositions,
                                std::vector<int>& genomePositions, bool usePadded) const
{
    // initialize positions & flags
    int refPosition = Position;
    int readPosition = 0;
    bool softClipFound = false;
    bool firstCigarOp = true;

    // iterate over cigar operations
    std::vector<CigarOp>::const_iterator cigarIter = CigarData.begin();
    std::vector<CigarOp>::const_iterator cigarEnd = CigarData.end();
    for (; cigarIter != cigarEnd; ++cigarIter) {
        const CigarOp& op = (*cigarIter);

        switch (op.Type) {

            // increase both read & genome positions on CIGAR chars [DMXN=]
            case Constants::BAM_CIGAR_DEL_CHAR:
            case Constants::BAM_CIGAR_MATCH_CHAR:
            case Constants::BAM_CIGAR_MISMATCH_CHAR:
            case Constants::BAM_CIGAR_REFSKIP_CHAR:
            case Constants::BAM_CIGAR_SEQMATCH_CHAR:
                refPosition += op.Length;
                readPosition += op.Length;
                break;

            // increase read position on insertion, genome position only if @usePadded is true
            case Constants::BAM_CIGAR_INS_CHAR:
                readPosition += op.Length;
                if (usePadded) refPosition += op.Length;
                break;

            case Constants::BAM_CIGAR_SOFTCLIP_CHAR:

                softClipFound = true;

                //////////////////////////////////////////////////////////////////////////////
                // if we are dealing with the *first* CIGAR operation
                // for this alignment, we increment the read position so that
                // the read and genome position of the clip are referring to the same base.
                // For example, in the alignment below, the ref position would be 4, yet
                //              the read position would be 0. Thus, to "sync" the two,
                //              we need to increment the read position by the length of the
                //              soft clip.
                // Read:  ATCGTTTCGTCCCTGC
                // Ref:   GGGATTTCGTCCCTGC
                // Cigar: SSSSMMMMMMMMMMMM
                //
                // NOTE: This only needs to be done if the soft clip is the _first_ CIGAR op.
                //////////////////////////////////////////////////////////////////////////////
                if (firstCigarOp) readPosition += op.Length;

                // track the soft clip's size, read position, and genome position
                clipSizes.push_back(op.Length);
                readPositions.push_back(readPosition);
                genomePositions.push_back(refPosition);

            // any other CIGAR operations have no effect
            default:
                break;
        }

        // clear our "first pass" flag
        firstCigarOp = false;
    }

    // return whether any soft clips found
    return softClipFound;
}